

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnet_unix_p.h
# Opt level: O0

int qt_safe_socket(int domain,int type,int protocol,int flags)

{
  int iVar1;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  int in_EDI;
  int newtype;
  int fd;
  undefined4 local_18;
  
  local_18 = in_ESI | 0x80000;
  if ((in_ECX & 0x800) != 0) {
    local_18 = in_ESI | 0x80800;
  }
  iVar1 = socket(in_EDI,local_18,in_EDX);
  return iVar1;
}

Assistant:

static inline int qt_safe_socket(int domain, int type, int protocol, int flags = 0)
{
    Q_ASSERT((flags & ~O_NONBLOCK) == 0);

    int fd;
#ifdef QT_THREADSAFE_CLOEXEC
    int newtype = type | SOCK_CLOEXEC;
    if (flags & O_NONBLOCK)
        newtype |= SOCK_NONBLOCK;
    fd = ::socket(domain, newtype, protocol);
    return fd;
#else
    fd = ::socket(domain, type, protocol);
    if (fd == -1)
        return -1;

    ::fcntl(fd, F_SETFD, FD_CLOEXEC);

    // set non-block too?
    if (flags & O_NONBLOCK)
        ::fcntl(fd, F_SETFL, ::fcntl(fd, F_GETFL) | O_NONBLOCK);

    return fd;
#endif
}